

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O0

int enet_address_set_host_old(ENetAddress *address,char *name)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  uint32_t uVar4;
  sockaddr_in6 *sin_1;
  sockaddr_in *sin;
  addrinfo *result;
  addrinfo *resultList;
  addrinfo hints;
  char *name_local;
  ENetAddress *address_local;
  
  result = (addrinfo *)0x0;
  hints.ai_next = (addrinfo *)name;
  memset(&resultList,0,0x30);
  resultList._4_4_ = 0;
  iVar3 = getaddrinfo((char *)hints.ai_next,(char *)0x0,(addrinfo *)&resultList,(addrinfo **)&result
                     );
  if (iVar3 == 0) {
    for (sin = (sockaddr_in *)result; sin != (sockaddr_in *)0x0;
        sin = *(sockaddr_in **)sin[2].sin_zero) {
      if ((*(long *)sin[1].sin_zero != 0) &&
         (uVar1._0_2_ = sin[1].sin_family, uVar1._2_2_ = sin[1].sin_port, 0xf < uVar1)) {
        if ((sin->sin_addr).s_addr == 2) {
          lVar2 = *(long *)sin[1].sin_zero;
          (address->host).__in6_u.__u6_addr32[0] = 0;
          (address->host).__in6_u.__u6_addr32[1] = 0;
          uVar4 = htonl(0xffff);
          (address->host).__in6_u.__u6_addr32[2] = uVar4;
          (address->host).__in6_u.__u6_addr32[3] = *(uint32_t *)(lVar2 + 4);
          freeaddrinfo((addrinfo *)result);
          return 0;
        }
        if ((sin->sin_addr).s_addr == 10) {
          lVar2 = *(long *)sin[1].sin_zero;
          *(undefined8 *)&(address->host).__in6_u = *(undefined8 *)(lVar2 + 8);
          *(undefined8 *)((long)&(address->host).__in6_u + 8) = *(undefined8 *)(lVar2 + 0x10);
          address->sin6_scope_id = (enet_uint16)*(undefined4 *)(lVar2 + 0x18);
          freeaddrinfo((addrinfo *)result);
          return 0;
        }
      }
    }
    freeaddrinfo((addrinfo *)result);
    address_local._4_4_ = enet_address_set_host_ip_old(address,(char *)hints.ai_next);
  }
  else {
    address_local._4_4_ = -1;
  }
  return address_local._4_4_;
}

Assistant:

int enet_address_set_host_old(ENetAddress *address, const char *name) {
        struct addrinfo hints, *resultList = NULL, *result = NULL;

        memset(&hints, 0, sizeof(hints));
        hints.ai_family = AF_UNSPEC;

        if (getaddrinfo(name, NULL, &hints, &resultList) != 0) {
            return -1;
        }

        for (result = resultList; result != NULL; result = result->ai_next) {
            if (result->ai_addr != NULL && result->ai_addrlen >= sizeof(struct sockaddr_in)) {
                if (result->ai_family == AF_INET) {
                    struct sockaddr_in * sin = (struct sockaddr_in *) result->ai_addr;

                    ((uint32_t *)&address->host.s6_addr)[0] = 0;
                    ((uint32_t *)&address->host.s6_addr)[1] = 0;
                    ((uint32_t *)&address->host.s6_addr)[2] = htonl(0xffff);
                    ((uint32_t *)&address->host.s6_addr)[3] = sin->sin_addr.s_addr;

                    freeaddrinfo(resultList);
                    return 0;
                }
                else if(result->ai_family == AF_INET6) {
                    struct sockaddr_in6 * sin = (struct sockaddr_in6 *)result->ai_addr;

                    address->host = sin->sin6_addr;
                    address->sin6_scope_id = sin->sin6_scope_id;

                    freeaddrinfo(resultList);
                    return 0;
                }
            }
        }
        freeaddrinfo(resultList);

        return enet_address_set_host_ip(address, name);
    }